

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

basic_appender<char>
fmt::v11::detail::write_float<char,fmt::v11::basic_appender<char>,long_double>
          (basic_appender<char> out,longdouble value,format_specs specs,locale_ref loc)

{
  unkbyte10 Var1;
  int iVar2;
  basic_appender<char> bVar3;
  size_t sVar4;
  ulong uVar5;
  sign s;
  uint uVar6;
  basic_specs bVar7;
  ulong uVar8;
  sign in_R9D;
  int precision;
  format_specs specs_00;
  format_specs specs_01;
  big_decimal_fp f;
  memory_buffer buffer;
  format_specs local_298;
  undefined1 local_288 [24];
  locale_ref local_270;
  longdouble local_264;
  big_decimal_fp local_258;
  buffer<char> local_248;
  char local_228 [504];
  
  uVar5 = specs._8_8_;
  bVar7 = specs.super_basic_specs;
  local_288._0_10_ = value;
  Var1 = local_288._0_10_;
  local_288._8_2_ = (undefined2)((unkuint10)value >> 0x40);
  uVar6 = specs.super_basic_specs.data_;
  s = minus;
  if (-1 < (short)local_288._8_2_) {
    s = uVar6 >> 10 & space;
  }
  local_298.super_basic_specs = bVar7;
  local_298._8_8_ = uVar5;
  local_288._0_10_ = Var1;
  if (((unkuint10)value & 0x7fff) != 0 &&
      ((ushort)((local_288._8_2_ & 0x7fff) - 1) < 0x7ffe & (byte)((unkuint10)value >> 0x38) >> 7) ==
      0) {
    bVar3.container._1_7_ = 0;
    bVar3.container._0_1_ = NAN(value);
    specs_01.width = s;
    specs_01.super_basic_specs.data_ = (int)uVar5;
    specs_01.super_basic_specs.fill_data_[0] = (char)(uVar5 >> 0x20);
    specs_01.super_basic_specs.fill_data_[1] = (char)(uVar5 >> 0x28);
    specs_01.super_basic_specs.fill_data_[2] = (char)(uVar5 >> 0x30);
    specs_01.super_basic_specs.fill_data_[3] = (char)(uVar5 >> 0x38);
    specs_01.precision = 0;
    bVar3 = write_nonfinite<char,fmt::v11::basic_appender<char>>
                      (out.container,bVar3,specs.super_basic_specs.data_._0_1_,specs_01,in_R9D);
    return (basic_appender<char>)bVar3.container;
  }
  local_270.locale_ = loc.locale_;
  if (s != none && (uVar6 & 0x38) == 0x20) {
    sVar4 = (out.container)->size_;
    uVar8 = sVar4 + 1;
    if ((out.container)->capacity_ < uVar8) {
      local_264 = value;
      (*(out.container)->grow_)(out.container,uVar8);
      sVar4 = (out.container)->size_;
      uVar8 = sVar4 + 1;
      value = local_264;
    }
    (out.container)->size_ = uVar8;
    (out.container)->ptr_[sVar4] = (char)(0x202b2d00 >> (sbyte)(s << 3));
    s = none;
    if (specs.width != 0) {
      local_298.width = specs.width + -1;
    }
  }
  precision = 6;
  if (((undefined1  [16])specs & (undefined1  [16])0x7) == (undefined1  [16])0x0) {
    precision = specs.precision;
  }
  if (-1 < (long)uVar5) {
    precision = specs.precision;
  }
  local_248.size_ = 0;
  local_248.grow_ = basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::grow;
  local_248.capacity_ = 500;
  local_248.ptr_ = local_228;
  if ((specs.super_basic_specs.data_._0_1_ & 7U) == 1) {
    if (precision == 0x7fffffff) {
      report_error("number is too big");
    }
    precision = precision + 1;
LAB_00347c0c:
    if (uVar5 >> 0x20 != 0) {
      local_298.super_basic_specs =
           (basic_specs)(CONCAT44(local_298.super_basic_specs.fill_data_,uVar6) | 0x2000);
    }
  }
  else {
    if ((uVar6 & 7) == 2) goto LAB_00347c0c;
    if ((uVar6 & 7) == 4) {
      if (s != none) {
        local_228[0] = (char)(0x202b2d00 >> (sbyte)(s << 3));
      }
      local_248.size_ = (size_t)(s != none);
      specs_00.width = local_298.width;
      specs_00.precision = local_298.precision;
      specs_00.super_basic_specs = bVar7;
      format_hexfloat<long_double,_0>(value,specs_00,&local_248);
      local_258.significand = local_248.ptr_;
      local_258.significand_size = (undefined4)local_248.size_;
      local_258.exponent = local_248.size_._4_4_;
      bVar3 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::write_bytes<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>>(fmt::v11::basic_appender<char>,fmt::v11::basic_string_view<char>,fmt::v11::format_specs_const&)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                        (out,&local_298,local_248.size_,local_248.size_,
                         (anon_class_16_1_a7b7af8b *)&local_258);
      goto LAB_00347c73;
    }
    precision = precision + (uint)(precision == 0);
  }
  iVar2 = format_float<long_double>(value,precision,&local_298,false,&local_248);
  local_298.precision = precision;
  local_258.significand = local_248.ptr_;
  local_258._8_8_ = CONCAT44(iVar2,(int)local_248.size_);
  bVar3 = do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp,fmt::v11::detail::digit_grouping<char>>
                    (out,&local_258,&local_298,s,0x10,local_270);
LAB_00347c73:
  if (local_248.ptr_ != local_228) {
    free(local_248.ptr_);
  }
  return (basic_appender<char>)bVar3.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_float(OutputIt out, T value, format_specs specs,
                                 locale_ref loc) -> OutputIt {
  // Use signbit because value < 0 is false for NaN.
  sign s = detail::signbit(value) ? sign::minus : specs.sign();

  if (!detail::isfinite(value))
    return write_nonfinite<Char>(out, detail::isnan(value), specs, s);

  if (specs.align() == align::numeric && s != sign::none) {
    *out++ = detail::getsign<Char>(s);
    s = sign::none;
    if (specs.width != 0) --specs.width;
  }

  constexpr int exp_upper = detail::exp_upper<T>();
  int precision = specs.precision;
  if (precision < 0) {
    if (specs.type() != presentation_type::none) {
      precision = 6;
    } else if (is_fast_float<T>::value && !is_constant_evaluated()) {
      // Use Dragonbox for the shortest format.
      using floaty = conditional_t<sizeof(T) >= sizeof(double), double, float>;
      auto dec = dragonbox::to_decimal(static_cast<floaty>(value));
      return write_float<Char>(out, dec, specs, s, exp_upper, loc);
    }
  }

  memory_buffer buffer;
  if (specs.type() == presentation_type::hexfloat) {
    if (s != sign::none) buffer.push_back(detail::getsign<char>(s));
    format_hexfloat(convert_float(value), specs, buffer);
    return write_bytes<Char, align::right>(out, {buffer.data(), buffer.size()},
                                           specs);
  }

  if (specs.type() == presentation_type::exp) {
    if (precision == max_value<int>())
      report_error("number is too big");
    else
      ++precision;
    if (specs.precision != 0) specs.set_alt();
  } else if (specs.type() == presentation_type::fixed) {
    if (specs.precision != 0) specs.set_alt();
  } else if (precision == 0) {
    precision = 1;
  }
  int exp = format_float(convert_float(value), precision, specs,
                         std::is_same<T, float>(), buffer);

  specs.precision = precision;
  auto f = big_decimal_fp{buffer.data(), static_cast<int>(buffer.size()), exp};
  return write_float<Char>(out, f, specs, s, exp_upper, loc);
}